

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ctype.c
# Opt level: O1

CTypeID lj_ctype_getname(CTState *cts,CType **ctp,GCstr *name,uint32_t tmask)

{
  CType *pCVar1;
  CType *pCVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  
  uVar4 = (uint)name + 0xfb3ee249;
  uVar6 = (uVar4 ^ (uint)name) - (uVar4 * 0x4000 | uVar4 >> 0x12);
  uVar5 = (ulong)((uVar4 >> 0xd ^ uVar6) - (uVar6 >> 0x13) & 0x7f);
  uVar4 = (uint)cts->hash[uVar5];
  do {
    pCVar2 = cts->tab;
    if (uVar4 == 0) {
      *ctp = pCVar2;
      return 0;
    }
    pCVar1 = pCVar2 + uVar4;
    if (((GCstr *)(ulong)pCVar2[uVar4].name.gcptr32 == name) &&
       ((tmask >> (pCVar1->info >> 0x1c) & 1) != 0)) {
      *ctp = pCVar1;
      bVar3 = false;
      uVar5 = (ulong)uVar4;
    }
    else {
      uVar4 = (uint)pCVar1->next;
      bVar3 = true;
    }
  } while (bVar3);
  return (CTypeID)uVar5;
}

Assistant:

CTypeID lj_ctype_getname(CTState *cts, CType **ctp, GCstr *name, uint32_t tmask)
{
  CTypeID id = cts->hash[ct_hashname(name)];
  while (id) {
    CType *ct = ctype_get(cts, id);
    if (gcref(ct->name) == obj2gco(name) &&
	((tmask >> ctype_type(ct->info)) & 1)) {
      *ctp = ct;
      return id;
    }
    id = ct->next;
  }
  *ctp = &cts->tab[0];  /* Simplify caller logic. ctype_get() would assert. */
  return 0;
}